

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listelem_alloc.c
# Opt level: O0

void listelem_alloc_free(listelem_alloc_t *list)

{
  glist_t local_18;
  gnode_t *gn;
  listelem_alloc_t *list_local;
  
  if (list != (listelem_alloc_t *)0x0) {
    for (local_18 = list->blocks; local_18 != (glist_t)0x0; local_18 = local_18->next) {
      ckd_free((local_18->data).ptr);
    }
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
  }
  return;
}

Assistant:

void
listelem_alloc_free(listelem_alloc_t *list)
{
    gnode_t *gn;
    if (list == NULL)
	return;
    for (gn = list->blocks; gn; gn = gnode_next(gn))
	ckd_free(gnode_ptr(gn));
    glist_free(list->blocks);
    glist_free(list->blocksize);
    ckd_free(list);
}